

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

Gia_Man_t * Bmc_ChainCleanup(Gia_Man_t *p,Vec_Int_t *vOutputs)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar3;
  int i;
  
  i = 0;
  while( true ) {
    if (vOutputs->nSize <= i) {
      pGVar3 = Gia_ManCleanup(p);
      return pGVar3;
    }
    iVar1 = Vec_IntEntry(vOutputs,i);
    pObj = Gia_ManPo(p,iVar1);
    iVar1 = Gia_ObjFaninLit0p(p,pObj);
    if (iVar1 == 0) break;
    if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x107,"void Gia_ObjMakePoConst0(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar2 = Gia_ObjId(p,pObj);
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffc0000000 | (ulong)(uVar2 & 0x1fffffff);
    iVar1 = Gia_ObjFaninLit0p(p,pObj);
    i = i + 1;
    if (iVar1 != 0) {
      __assert_fail("Gia_ObjFaninLit0p(p, pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                    ,0x11b,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
    }
  }
  __assert_fail("Gia_ObjFaninLit0p(p, pObj) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                ,0x119,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Bmc_ChainCleanup( Gia_Man_t * p, Vec_Int_t * vOutputs )
{
    int i, iOut;
    Vec_IntForEachEntry( vOutputs, iOut, i )
    {
        Gia_Obj_t * pObj = Gia_ManPo( p, iOut );
        assert( Gia_ObjFaninLit0p(p, pObj) != 0 );
        Gia_ObjMakePoConst0( p, pObj );
        assert( Gia_ObjFaninLit0p(p, pObj) == 0 );
    }
    return Gia_ManCleanup( p );
}